

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Value_List
toward_beginning(Am_Value_List *parts,Am_Value_List *old_value,bool to_home,bool extend)

{
  byte bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value_List *pAVar4;
  ostream *poVar5;
  Am_Wrapper *pAVar6;
  undefined7 in_register_00000011;
  Am_List_Item *extraout_RDX;
  byte in_R8B;
  Am_Value_List AVar7;
  int local_54;
  int index;
  Am_Object local_40;
  Am_Object object;
  Am_Value_List new_value;
  bool extend_local;
  bool to_home_local;
  Am_Value_List *old_value_local;
  Am_Value_List *parts_local;
  
  pAVar4 = (Am_Value_List *)CONCAT71(in_register_00000011,to_home);
  bVar1 = in_R8B & 1;
  Am_Value_List::Am_Value_List((Am_Value_List *)&object);
  Am_Object::Am_Object(&local_40);
  if ((bVar1 == 0) && (extend)) {
    Am_Value_List::Start(old_value);
    pAVar3 = Am_Value_List::Get(old_value);
    pAVar4 = Am_Value_List::Add((Am_Value_List *)&object,pAVar3,Am_TAIL,true);
    Am_Value_List::Am_Value_List(parts,pAVar4);
  }
  else {
    bVar2 = Am_Value_List::Valid(pAVar4);
    if (bVar2) {
      local_54 = -1;
      Am_Value_List::End(old_value);
      while (bVar2 = Am_Value_List::First(old_value), ((bVar2 ^ 0xffU) & 1) != 0) {
        pAVar3 = Am_Value_List::Get(old_value);
        Am_Object::operator=(&local_40,pAVar3);
        pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
        bVar2 = Am_Value_List::Start_Member(pAVar4,pAVar6);
        if (bVar2) {
          local_54 = Am_Value_List::Nth(old_value);
        }
        Am_Value_List::Prev(old_value);
      }
      if (local_54 == -1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar5 = std::operator<<(poVar5,"Lost old value ");
        poVar5 = operator<<(poVar5,pAVar4);
        poVar5 = std::operator<<(poVar5," from parts list for selection widget ");
        poVar5 = operator<<(poVar5,old_value);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      if (local_54 == 0) {
        if (extend) {
          if (bVar1 == 0) {
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
            pAVar4 = Am_Value_List::Add((Am_Value_List *)&object,pAVar6,Am_TAIL,true);
            Am_Value_List::Am_Value_List(parts,pAVar4);
          }
          else {
            Am_Value_List::Am_Value_List(parts,pAVar4);
          }
        }
        else {
          Am_Value_List::Am_Value_List(parts,&Am_No_Value_List);
        }
        goto LAB_0033a811;
      }
      Am_Value_List::Move_Nth(old_value,local_54 + -1);
      if (bVar1 == 0) {
        pAVar3 = Am_Value_List::Get(old_value);
        Am_Value_List::Add((Am_Value_List *)&object,pAVar3,Am_TAIL,true);
      }
      else {
        Am_Value_List::operator=((Am_Value_List *)&object,pAVar4);
        if (extend) {
          while (bVar2 = Am_Value_List::First(old_value), ((bVar2 ^ 0xffU) & 1) != 0) {
            pAVar3 = Am_Value_List::Get(old_value);
            Am_Object::operator=(&local_40,pAVar3);
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
            Am_Value_List::Add((Am_Value_List *)&object,pAVar6,Am_TAIL,true);
            Am_Value_List::Prev(old_value);
          }
        }
        else {
          pAVar3 = Am_Value_List::Get(old_value);
          Am_Value_List::Add((Am_Value_List *)&object,pAVar3,Am_TAIL,true);
        }
      }
    }
    else {
      Am_Value_List::End(old_value);
      pAVar3 = Am_Value_List::Get(old_value);
      Am_Value_List::Add((Am_Value_List *)&object,pAVar3,Am_TAIL,true);
    }
    Am_Value_List::Am_Value_List(parts,(Am_Value_List *)&object);
  }
LAB_0033a811:
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&object);
  AVar7.item = extraout_RDX;
  AVar7.data = (Am_Value_List_Data *)parts;
  return AVar7;
}

Assistant:

Am_Value_List
toward_beginning(Am_Value_List &parts, Am_Value_List &old_value, bool to_home,
                 bool extend)
{
  Am_Value_List new_value;
  Am_Object object;
  if (!extend && to_home) { //the easy case
    parts.Start();
    return new_value.Add(parts.Get());
  }
  if (old_value.Valid()) {
    int index = -1;
    for (parts.End(); !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (old_value.Start_Member(object))
        index = parts.Nth();
    }
    if (index == -1)
      Am_ERROR("Lost old value " << old_value
                                 << " from parts list for selection widget "
                                 << parts);
    if (index == 0) {
      if (to_home) {
        if (extend)
          return old_value; //already have beginning in list
        else
          return new_value.Add(object); //object is left assigned to first
      } else
        return Am_No_Value_List; //already at home, cannot go further
    }
    parts.Move_Nth(index - 1);
    if (extend) {
      new_value = old_value;
      if (to_home) {
        for (; !parts.First(); parts.Prev()) {
          object = parts.Get();
          new_value.Add(object);
        }
      } else
        new_value.Add(parts.Get()); //just add that one
    } else {                        //not extend
      new_value.Add(parts.Get());
    }
  } else { //no old_value
    parts.End();
    new_value.Add(parts.Get());
  }
  return new_value;
}